

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetStaticLibraryFlags
          (cmLocalGenerator *this,string *flags,string *config,cmTarget *target)

{
  cmMakefile *this_00;
  char *pcVar1;
  string name;
  allocator local_49;
  string local_48;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_48,"CMAKE_STATIC_LINKER_FLAGS",&local_49);
  pcVar1 = cmMakefile::GetSafeDefinition(this_00,&local_48);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar1);
  std::__cxx11::string::~string((string *)&local_48);
  if (config->_M_string_length != 0) {
    std::operator+(&local_48,"CMAKE_STATIC_LINKER_FLAGS_",config);
    pcVar1 = cmMakefile::GetSafeDefinition(this->Makefile,&local_48);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::string((string *)&local_48,"STATIC_LIBRARY_FLAGS",&local_49);
  pcVar1 = cmTarget::GetProperty(target,&local_48);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar1);
  std::__cxx11::string::~string((string *)&local_48);
  if (config->_M_string_length != 0) {
    std::operator+(&local_48,"STATIC_LIBRARY_FLAGS_",config);
    pcVar1 = cmTarget::GetProperty(target,&local_48);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetStaticLibraryFlags(std::string& flags,
                                             std::string const& config,
                                             cmTarget* target)
{
  this->AppendFlags(flags,
    this->Makefile->GetSafeDefinition("CMAKE_STATIC_LINKER_FLAGS"));
  if(!config.empty())
    {
    std::string name = "CMAKE_STATIC_LINKER_FLAGS_" + config;
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(name));
    }
  this->AppendFlags(flags, target->GetProperty("STATIC_LIBRARY_FLAGS"));
  if(!config.empty())
    {
    std::string name = "STATIC_LIBRARY_FLAGS_" + config;
    this->AppendFlags(flags, target->GetProperty(name));
    }
}